

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::SetValue(XMLNode *this,char *str,bool staticMem)

{
  bool staticMem_local;
  char *str_local;
  XMLNode *this_local;
  
  if (staticMem) {
    StrPair::SetInternedStr(&this->_value,str);
  }
  else {
    StrPair::SetStr(&this->_value,str,0);
  }
  return;
}

Assistant:

void XMLNode::SetValue( const char* str, bool staticMem )
{
    if ( staticMem ) {
        _value.SetInternedStr( str );
    }
    else {
        _value.SetStr( str );
    }
}